

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::BrProperty
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot instance,
          PropertyIdIndexType index)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  undefined2 local_3a;
  RegSlot local_38;
  undefined1 auStack_34 [2];
  OpLayoutBrProperty data;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  PropertyIdIndexType local_20;
  RegSlot local_1c;
  PropertyIdIndexType index_local;
  RegSlot instance_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = index;
  local_1c = instance;
  index_local = labelID;
  instance_local._2_2_ = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = instance_local._2_2_;
  OpLayoutType::OpLayoutType
            ((OpLayoutType *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),BrProperty);
  CheckOp(this,op_00,offsetOfRelativeJumpOffsetFromEnd._4_4_);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(instance_local._2_2_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x373,"(!OpCodeAttr::HasMultiSizeLayout(op))",
                                "!OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckLabel(this,index_local);
  local_38 = ConsumeReg(this,local_1c);
  data.Instance = 10;
  data.PropertyIdIndex = 0;
  local_3a = 10;
  _auStack_34 = local_20;
  local_1c = local_38;
  Data::Encode(&this->m_byteCodeData,instance_local._2_2_,&local_3a,10,this);
  AddJumpOffset(this,instance_local._2_2_,index_local,10);
  return;
}

Assistant:

void ByteCodeWriter::BrProperty(OpCode op, ByteCodeLabel labelID, RegSlot instance, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrProperty);
        Assert(!OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        instance = ConsumeReg(instance);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutBrProperty) - offsetof(OpLayoutBrProperty, RelativeJumpOffset);
        OpLayoutBrProperty data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
        data.Instance = instance;
        data.PropertyIdIndex = index;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }